

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

bool __thiscall File::writeString(File *this,string *value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ByteString toWrite;
  ByteString local_40;
  
  if (this->valid == true) {
    ByteString::ByteString(&local_40,value->_M_string_length);
    __ptr = ByteString::const_byte_str(&local_40);
    sVar1 = ByteString::size(&local_40);
    sVar2 = fwrite(__ptr,1,sVar1,(FILE *)this->stream);
    sVar1 = ByteString::size(&local_40);
    if (sVar2 == sVar1) {
      sVar2 = fwrite((value->_M_dataplus)._M_p,1,value->_M_string_length,(FILE *)this->stream);
      bVar3 = sVar2 == value->_M_string_length;
    }
    else {
      bVar3 = false;
    }
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool File::writeString(const std::string& value)
{
	if (!valid) return false;

	ByteString toWrite((unsigned long) value.size());

	// Write the value to the file
	if ((fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size()) ||
	    (fwrite(&value[0], 1, value.size(), stream) != value.size()))
	{
		return false;
	}

	return true;
}